

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAGenerateAllTransition
               (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int lax)

{
  xmlRegStatePtr pxStack_20;
  int lax_local;
  xmlRegStatePtr to_local;
  xmlRegStatePtr from_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxStack_20 = to;
  if (to == (xmlRegStatePtr)0x0) {
    pxStack_20 = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt,pxStack_20);
    ctxt->state = pxStack_20;
  }
  if (lax == 0) {
    xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,pxStack_20,-1,0x123456);
  }
  else {
    xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,pxStack_20,-1,0x123457);
  }
  return;
}

Assistant:

static void
xmlFAGenerateAllTransition(xmlRegParserCtxtPtr ctxt,
			   xmlRegStatePtr from, xmlRegStatePtr to,
			   int lax) {
    if (to == NULL) {
	to = xmlRegNewState(ctxt);
	xmlRegStatePush(ctxt, to);
	ctxt->state = to;
    }
    if (lax)
	xmlRegStateAddTrans(ctxt, from, NULL, to, -1, REGEXP_ALL_LAX_COUNTER);
    else
	xmlRegStateAddTrans(ctxt, from, NULL, to, -1, REGEXP_ALL_COUNTER);
}